

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool __thiscall cppcms::xss::uri_parser::port(uri_parser *this)

{
  char *pcVar1;
  
  pcVar1 = this->begin_;
  while ((pcVar1 != this->end_ && ((byte)(*pcVar1 - 0x30U) < 10))) {
    pcVar1 = pcVar1 + 1;
    this->begin_ = pcVar1;
  }
  return true;
}

Assistant:

bool port()
		{
			while((begin_!=end_) && is_digit(*begin_))
				begin_++;
			return true;
		}